

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppRole.cpp
# Opt level: O2

Url * __thiscall Vault::AppRole::getUrl(Url *__return_storage_ptr__,AppRole *this,Path *path)

{
  long *plVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  plVar1 = *(long **)this;
  Vault::operator+(&local_40,"/v1/auth/",
                   (Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(this + 8));
  std::operator+(&local_60,&local_40,"/role/");
  (**(code **)(*plVar1 + 0x18))(__return_storage_ptr__,plVar1,&local_60,path);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::AppRole::getUrl(const Path &path) const {
  return client_.getUrl("/v1/auth/" + mount_ + "/role/", path);
}